

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitput.c
# Opt level: O3

void mpp_put_align(BitputCtx_t *bp,RK_S32 align_bits,int flag)

{
  int iVar1;
  RK_U64 RVar2;
  uint lbits;
  ulong uVar3;
  
  iVar1 = 0;
  if (0x3f < align_bits) {
    iVar1 = (((uint)align_bits >> 6 & 0x3f) - 1 & bp->index) * -0x40;
  }
  uVar3 = (ulong)(uint)((iVar1 + align_bits) - (int)((long)(ulong)bp->bitpos % (long)align_bits)) %
          (ulong)(uint)align_bits;
  if ((int)uVar3 != 0) {
    RVar2 = 0xff;
    if (flag == 0) {
      RVar2 = 0;
    }
    do {
      lbits = (uint)uVar3;
      if (lbits < 8) {
        RVar2 = 0;
        if (flag != 0) {
          RVar2 = 0xffffffffffffffff >> (-(char)uVar3 & 0x3fU);
        }
        mpp_put_bits(bp,RVar2,lbits);
        return;
      }
      mpp_put_bits(bp,RVar2,8);
      uVar3 = (ulong)(lbits - 8);
    } while (lbits - 8 != 0);
  }
  return;
}

Assistant:

void mpp_put_align(BitputCtx_t *bp, RK_S32 align_bits, int flag)
{
    RK_U32 word_offset = 0,  len = 0;

    word_offset = (align_bits >= 64) ? ((bp->index & (((align_bits & 0xfe0) >> 6) - 1)) << 6) : 0;
    len = (align_bits - (word_offset + (bp->bitpos % align_bits))) % align_bits;
    while (len > 0) {
        if (len >= 8) {
            if (flag == 0)
                mpp_put_bits(bp, ((RK_U64)0 << (64 - 8)) >> (64 - 8), 8);
            else
                mpp_put_bits(bp, (0xffffffffffffffff << (64 - 8)) >> (64 - 8), 8);
            len -= 8;
        } else {
            if (flag == 0)
                mpp_put_bits(bp, ((RK_U64)0 << (64 - len)) >> (64 - len), len);
            else
                mpp_put_bits(bp, (0xffffffffffffffff << (64 - len)) >> (64 - len), len);
            len -= len;
        }
    }
}